

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L12_read_scale_info(uint8_t *hdr,bs_t *bs,L12_scale_info *sci)

{
  uint8_t uVar1;
  uint32_t uVar2;
  long in_RDX;
  bs_t *in_RSI;
  long in_RDI;
  uint8_t ba;
  uint8_t *ba_code_tab;
  int ba_bits;
  int k;
  int i;
  L12_subband_alloc_t *subband_alloc;
  undefined1 local_5c;
  undefined1 local_58;
  L12_scale_info *in_stack_ffffffffffffffb0;
  L12_scale_info *pLVar3;
  L12_scale_info *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  uint8_t in_stack_ffffffffffffffc7;
  uint8_t *pba;
  undefined4 in_stack_ffffffffffffffd0;
  uint n;
  int local_28;
  uint local_24;
  L12_subband_alloc_t *local_20;
  
  local_20 = L12_subband_alloc_table
                       ((uint8_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
  local_28 = 0;
  n = 0;
  pba = "";
  for (local_24 = 0; (int)local_24 < (int)(uint)*(byte *)(in_RDX + 0x300); local_24 = local_24 + 1)
  {
    in_stack_ffffffffffffffb8 = (L12_scale_info *)pba;
    if (local_24 == local_28) {
      local_28 = (uint)local_20->band_count + local_28;
      n = (uint)local_20->code_tab_width;
      in_stack_ffffffffffffffb8 = (L12_scale_info *)("" + (int)(uint)local_20->tab_offset);
      local_20 = local_20 + 1;
    }
    pLVar3 = in_stack_ffffffffffffffb8;
    uVar2 = get_bits(in_RSI,n);
    in_stack_ffffffffffffffc7 = *(uint8_t *)((long)in_stack_ffffffffffffffb8->scf + (ulong)uVar2);
    *(uint8_t *)(in_RDX + 0x302 + (long)(int)(local_24 << 1)) = in_stack_ffffffffffffffc7;
    pba = (uint8_t *)pLVar3;
    if ((int)local_24 < (int)(uint)*(byte *)(in_RDX + 0x301)) {
      uVar2 = get_bits(in_RSI,n);
      in_stack_ffffffffffffffc7 = *(uint8_t *)((long)pLVar3->scf + (ulong)uVar2);
      in_stack_ffffffffffffffb0 = pLVar3;
    }
    uVar1 = in_stack_ffffffffffffffc7;
    if (*(char *)(in_RDX + 0x301) == '\0') {
      uVar1 = '\0';
    }
    *(uint8_t *)(in_RDX + 0x302 + (long)(int)(local_24 * 2 + 1)) = uVar1;
  }
  for (local_24 = 0; (int)local_24 < (int)((uint)*(byte *)(in_RDX + 0x300) * 2);
      local_24 = local_24 + 1) {
    if (*(char *)(in_RDX + 0x302 + (long)(int)local_24) == '\0') {
      local_5c = 6;
    }
    else {
      if ((*(byte *)(in_RDI + 1) & 6) == 6) {
        local_58 = 2;
      }
      else {
        uVar2 = get_bits(in_RSI,2);
        local_58 = (undefined1)uVar2;
      }
      local_5c = local_58;
    }
    *(undefined1 *)(in_RDX + 0x342 + (long)(int)local_24) = local_5c;
  }
  L12_read_scalefactors
            ((bs_t *)CONCAT44(n,in_stack_ffffffffffffffd0),pba,
             (uint8_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0->scf);
  for (local_24 = (uint)*(byte *)(in_RDX + 0x301);
      (int)local_24 < (int)(uint)*(byte *)(in_RDX + 0x300); local_24 = local_24 + 1) {
    *(undefined1 *)(in_RDX + 0x302 + (long)(int)(local_24 * 2 + 1)) = 0;
  }
  return;
}

Assistant:

static void L12_read_scale_info(const uint8_t *hdr, bs_t *bs, L12_scale_info *sci)
{
    static const uint8_t g_bitalloc_code_tab[] = {
        0,17, 3, 4, 5,6,7, 8,9,10,11,12,13,14,15,16,
        0,17,18, 3,19,4,5, 6,7, 8, 9,10,11,12,13,16,
        0,17,18, 3,19,4,5,16,
        0,17,18,16,
        0,17,18,19, 4,5,6, 7,8, 9,10,11,12,13,14,15,
        0,17,18, 3,19,4,5, 6,7, 8, 9,10,11,12,13,14,
        0, 2, 3, 4, 5,6,7, 8,9,10,11,12,13,14,15,16
    };
    const L12_subband_alloc_t *subband_alloc = L12_subband_alloc_table(hdr, sci);

    int i, k = 0, ba_bits = 0;
    const uint8_t *ba_code_tab = g_bitalloc_code_tab;

    for (i = 0; i < sci->total_bands; i++)
    {
        uint8_t ba;
        if (i == k)
        {
            k += subband_alloc->band_count;
            ba_bits = subband_alloc->code_tab_width;
            ba_code_tab = g_bitalloc_code_tab + subband_alloc->tab_offset;
            subband_alloc++;
        }
        ba = ba_code_tab[get_bits(bs, ba_bits)];
        sci->bitalloc[2*i] = ba;
        if (i < sci->stereo_bands)
        {
            ba = ba_code_tab[get_bits(bs, ba_bits)];
        }
        sci->bitalloc[2*i + 1] = sci->stereo_bands ? ba : 0;
    }

    for (i = 0; i < 2*sci->total_bands; i++)
    {
        sci->scfcod[i] = sci->bitalloc[i] ? HDR_IS_LAYER_1(hdr) ? 2 : get_bits(bs, 2) : 6;
    }

    L12_read_scalefactors(bs, sci->bitalloc, sci->scfcod, sci->total_bands*2, sci->scf);

    for (i = sci->stereo_bands; i < sci->total_bands; i++)
    {
        sci->bitalloc[2*i + 1] = 0;
    }
}